

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall BotscriptParser::parseBreak(BotscriptParser *this)

{
  ScopeType SVar1;
  _Map_pointer ppSVar2;
  int iVar3;
  _Elt_pointer pSVar4;
  difference_type __node_offset_1;
  _Elt_pointer pSVar5;
  difference_type __node_offset;
  long lVar6;
  ByteMark *mark;
  DataBuffer *pDVar7;
  int local_20;
  int local_1c;
  
  if (this->m_scopeCursor == 0) {
    error<>("unexpected `break`");
  }
  pDVar7 = this->m_switchBuffer;
  if (pDVar7 == (DataBuffer *)0x0) {
    if (this->m_currentMode == Onenter) {
      pDVar7 = this->m_onenterBuffer;
    }
    else if (this->m_currentMode == MainLoop) {
      pDVar7 = this->m_mainLoopBuffer;
    }
    else {
      pDVar7 = this->m_mainBuffer;
    }
  }
  DataBuffer::writeHeader(pDVar7,Goto);
  local_20 = this->m_scopeCursor;
  ppSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur) >> 3) * 0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar2 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar2 == (_Map_pointer)0x0);
  if (iVar3 <= local_20) {
    local_1c = iVar3;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_20,&local_1c);
  }
  pSVar4 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar6 = ((long)pSVar4 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
          (long)local_20;
  if (lVar6 == 0) {
    pSVar5 = pSVar4 + local_20;
  }
  else {
    pSVar5 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar6];
  }
  SVar1 = pSVar5->type;
  if (SVar1 - 2 < 2) {
    pDVar7 = this->m_switchBuffer;
    if (pDVar7 == (DataBuffer *)0x0) {
      if (this->m_currentMode == Onenter) {
        pDVar7 = this->m_onenterBuffer;
      }
      else if (this->m_currentMode == MainLoop) {
        pDVar7 = this->m_mainLoopBuffer;
      }
      else {
        pDVar7 = this->m_mainBuffer;
      }
    }
    local_20 = this->m_scopeCursor;
    ppSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar3 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_start._M_last - (long)pSVar4) >> 3) *
            0x677d46cf +
            (int)((ulong)((long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
            (int)((ulong)((long)ppSVar2 -
                         (long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppSVar2 == (_Map_pointer)0x0);
    if (iVar3 <= local_20) {
      local_1c = iVar3;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                     ,&local_20,&local_1c);
    }
    pSVar4 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar6 = ((long)pSVar4 -
             (long)(this->m_scopeStack)._deque.
                   super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
            (long)local_20;
    if (lVar6 == 0) {
      pSVar4 = pSVar4 + local_20;
    }
    else {
      pSVar4 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node[lVar6];
    }
    mark = pSVar4->mark2;
  }
  else {
    if ((SVar1 != SCOPE_Switch) && (SVar1 != SCOPE_If)) {
      error<>("unexpected `break`");
      goto LAB_001289b6;
    }
    pDVar7 = this->m_switchBuffer;
    if (pDVar7 == (DataBuffer *)0x0) {
      if (this->m_currentMode == Onenter) {
        pDVar7 = this->m_onenterBuffer;
      }
      else if (this->m_currentMode == MainLoop) {
        pDVar7 = this->m_mainLoopBuffer;
      }
      else {
        pDVar7 = this->m_mainBuffer;
      }
    }
    local_20 = this->m_scopeCursor;
    ppSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar3 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_start._M_last - (long)pSVar4) >> 3) *
            0x677d46cf +
            (int)((ulong)((long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
            (int)((ulong)((long)ppSVar2 -
                         (long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppSVar2 == (_Map_pointer)0x0);
    if (iVar3 <= local_20) {
      local_1c = iVar3;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                     ,&local_20,&local_1c);
    }
    pSVar4 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    lVar6 = ((long)pSVar4 -
             (long)(this->m_scopeStack)._deque.
                   super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
            (long)local_20;
    if (lVar6 == 0) {
      pSVar4 = pSVar4 + local_20;
    }
    else {
      pSVar4 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node[lVar6];
    }
    mark = pSVar4->mark1;
  }
  DataBuffer::addReference(pDVar7,mark);
LAB_001289b6:
  Lexer::mustGetNext(this->m_lexer,Semicolon);
  return;
}

Assistant:

void BotscriptParser::parseBreak()
{
	if (m_scopeCursor == 0)
		error ("unexpected `break`");

	currentBuffer()->writeHeader (DataHeader::Goto);

	// switch and if use mark1 for the closing point,
	// for and while use mark2.
	switch (SCOPE (0).type)
	{
		case SCOPE_If:
		case SCOPE_Switch:
			currentBuffer()->addReference (SCOPE (0).mark1);
			break;

		case SCOPE_For:
		case SCOPE_While:
			currentBuffer()->addReference (SCOPE (0).mark2);
			break;

		default:
			error ("unexpected `break`");
			break;
	}

	m_lexer->mustGetNext (Token::Semicolon);
}